

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t duckdb_zstd::ZSTD_count_2segments(BYTE *ip,BYTE *match,BYTE *iEnd,BYTE *mEnd,BYTE *iStart)

{
  size_t sVar1;
  BYTE *in_RCX;
  BYTE *in_RDX;
  BYTE *in_RSI;
  size_t matchLength;
  BYTE *vEnd;
  size_t local_8;
  
  local_8 = ZSTD_count(in_RSI,in_RDX,in_RCX);
  if (in_RSI + local_8 == in_RCX) {
    sVar1 = ZSTD_count(in_RSI,in_RDX,in_RCX);
    local_8 = local_8 + sVar1;
  }
  return local_8;
}

Assistant:

MEM_STATIC size_t
ZSTD_count_2segments(const BYTE* ip, const BYTE* match,
                     const BYTE* iEnd, const BYTE* mEnd, const BYTE* iStart)
{
    const BYTE* const vEnd = MIN( ip + (mEnd - match), iEnd);
    size_t const matchLength = ZSTD_count(ip, match, vEnd);
    if (match + matchLength != mEnd) return matchLength;
    DEBUGLOG(7, "ZSTD_count_2segments: found a 2-parts match (current length==%zu)", matchLength);
    DEBUGLOG(7, "distance from match beginning to end dictionary = %zi", mEnd - match);
    DEBUGLOG(7, "distance from current pos to end buffer = %zi", iEnd - ip);
    DEBUGLOG(7, "next byte : ip==%02X, istart==%02X", ip[matchLength], *iStart);
    DEBUGLOG(7, "final match length = %zu", matchLength + ZSTD_count(ip+matchLength, iStart, iEnd));
    return matchLength + ZSTD_count(ip+matchLength, iStart, iEnd);
}